

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hpp
# Opt level: O2

void __thiscall Options::~Options(Options *this)

{
  std::_Optional_payload_base<std::filesystem::__cxx11::path>::_M_reset
            ((_Optional_payload_base<std::filesystem::__cxx11::path> *)&this->input);
  std::_Optional_payload_base<std::filesystem::__cxx11::path>::_M_reset
            ((_Optional_payload_base<std::filesystem::__cxx11::path> *)&this->tilemap);
  std::_Optional_payload_base<std::filesystem::__cxx11::path>::_M_reset
            ((_Optional_payload_base<std::filesystem::__cxx11::path> *)&this->palmap);
  std::_Optional_payload_base<std::filesystem::__cxx11::path>::_M_reset
            ((_Optional_payload_base<std::filesystem::__cxx11::path> *)&this->palettes);
  std::_Optional_payload_base<std::filesystem::__cxx11::path>::_M_reset
            ((_Optional_payload_base<std::filesystem::__cxx11::path> *)&this->output);
  std::_Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::~_Vector_base
            (&(this->palSpec).
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>);
  std::_Optional_payload_base<std::filesystem::__cxx11::path>::_M_reset
            ((_Optional_payload_base<std::filesystem::__cxx11::path> *)&this->attrmap);
  return;
}

Assistant:

bool reverse() const { return reversedWidth != 0; }